

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewEdgeCalculator.cpp
# Opt level: O1

void __thiscall
NewEdgeCalculator::iterateRemainingCovAp
          (NewEdgeCalculator *this,int *tc,bool pe1,
          vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_> *cov_ap2,
          bool pe2,double *prob0,AlignmentRecord *ap1,AlignmentRecord *ap2,
          vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_> *cov_ap1,
          uint *pos1)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  pointer pmVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar6 = (ulong)*pos1;
  pmVar4 = (cov_ap1->
           super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar5 = ((long)(cov_ap1->
                 super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pmVar4 >> 3) *
          -0x5555555555555555;
  if (uVar6 <= uVar5 && uVar5 - uVar6 != 0) {
    do {
      pmVar4 = pmVar4 + uVar6;
      if (pe1 && pe2) {
        uVar2 = AlignmentRecord::getStart2(ap1);
        uVar3 = AlignmentRecord::getEnd2(ap2);
        if ((uVar3 < uVar2) &&
           (uVar2 = pmVar4->ref, uVar3 = AlignmentRecord::getStart2(ap1), uVar3 <= uVar2)) {
          return;
        }
      }
      else if (pmVar4->read !=
               (cov_ap2->
               super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>
               )._M_impl.super__Vector_impl_data._M_finish[-1].read) {
        return;
      }
      dVar1 = (this->SIMPSON_MAP).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[pmVar4->ref];
      uVar6 = -(ulong)(dVar1 != 0.0);
      *prob0 = (double)(~uVar6 & 0xbfe34413509f79ff | (ulong)dVar1 & uVar6) + *prob0;
      *pos1 = *pos1 + 1;
      *tc = *tc + 1;
      uVar6 = (ulong)*pos1;
      pmVar4 = (cov_ap1->
               super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar5 = ((long)(cov_ap1->
                     super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pmVar4 >> 3) *
              -0x5555555555555555;
    } while (uVar6 <= uVar5 && uVar5 - uVar6 != 0);
  }
  return;
}

Assistant:

void NewEdgeCalculator::iterateRemainingCovAp(int& tc, bool pe1, const std::vector<AlignmentRecord::mapValue>& cov_ap2, bool pe2, double& prob0, const AlignmentRecord& ap1, const AlignmentRecord& ap2, const std::vector<AlignmentRecord::mapValue>& cov_ap1, unsigned int& pos1) const
{
    while(pos1 < cov_ap1.size()){
        auto& v1 = cov_ap1[pos1];
        if(pe1 && pe2){
            if(ap1.getStart2() > ap2.getEnd2() && v1.ref >= ap1.getStart2()) break;
            else {
                calculateProb0(v1,prob0);
                pos1++;
                tc++;
            }
        }
        else if (v1.read == cov_ap2.back().read){
            calculateProb0(v1,prob0);
            pos1++;
            tc++;
        } else break;
    }
}